

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  huff_entropy_ptr_conflict entropy_00;
  jpeg_component_info *pjVar3;
  int iVar4;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  int Al;
  int ci;
  int blkn;
  int nbits;
  int temp2;
  int temp;
  huff_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_compress_ptr cinfo_local;
  
  entropy_00 = (huff_entropy_ptr_conflict)cinfo->entropy;
  iVar1 = cinfo->Al;
  entropy_00->next_output_byte = cinfo->dest->next_output_byte;
  entropy_00->free_in_buffer = cinfo->dest->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy_00->restarts_to_go == 0)) {
    emit_restart_e(entropy_00,entropy_00->next_restart_num);
  }
  for (Al = 0; Al < cinfo->blocks_in_MCU; Al = Al + 1) {
    iVar2 = cinfo->MCU_membership[Al];
    pjVar3 = cinfo->cur_comp_info[iVar2];
    iVar4 = (int)(*MCU_data[Al])[0] >> ((byte)iVar1 & 0x1f);
    blkn = iVar4 - (entropy_00->saved).last_dc_val[iVar2];
    (entropy_00->saved).last_dc_val[iVar2] = iVar4;
    nbits = blkn;
    if (blkn < 0) {
      nbits = -blkn;
      blkn = blkn + -1;
    }
    ci = 0;
    for (; nbits != 0; nbits = nbits >> 1) {
      ci = ci + 1;
    }
    if (0xb < ci) {
      cinfo->err->msg_code = 6;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    emit_dc_symbol(entropy_00,pjVar3->dc_tbl_no,ci);
    if (ci != 0) {
      emit_bits_e(entropy_00,blkn,ci);
    }
  }
  cinfo->dest->next_output_byte = entropy_00->next_output_byte;
  cinfo->dest->free_in_buffer = entropy_00->free_in_buffer;
  if (cinfo->restart_interval != 0) {
    if (entropy_00->restarts_to_go == 0) {
      entropy_00->restarts_to_go = cinfo->restart_interval;
      entropy_00->next_restart_num = entropy_00->next_restart_num + 1;
      entropy_00->next_restart_num = entropy_00->next_restart_num & 7;
    }
    entropy_00->restarts_to_go = entropy_00->restarts_to_go - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl;
  int v, v2, m;
  ISHIFT_TEMPS

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    m = IRIGHT_SHIFT((int) ((*block)[0]), cinfo->Al);

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = m - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;	/* zero diff category */
    } else {
      entropy->last_dc_val[ci] = m;
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, st + 1, 0);	/* Table F.4: SS = S0 + 1 */
	st += 2;			/* Table F.4: SP = S0 + 2 */
	entropy->dc_context[ci] = 4;	/* small positive diff category */
      } else {
	v = -v;
	arith_encode(cinfo, st + 1, 1);	/* Table F.4: SS = S0 + 1 */
	st += 3;			/* Table F.4: SN = S0 + 3 */
	entropy->dc_context[ci] = 8;	/* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
	while (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st += 1;
	}
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;	/* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] += 8;	/* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
  }

  return TRUE;
}